

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O1

void __thiscall
duckdb::FSSTCompressionState::UpdateState
          (FSSTCompressionState *this,string_t uncompressed_string,uchar *compressed_string,
          size_t compressed_string_len)

{
  atomic<unsigned_long> *paVar1;
  BlockManager *pBVar2;
  iterator __position;
  long lVar3;
  bool bVar4;
  bitpacking_width_t bVar5;
  uint uVar6;
  pointer pCVar7;
  InternalException *this_00;
  bitpacking_width_t bVar8;
  unsigned_long value;
  string local_58;
  anon_union_16_2_67f50693_for_value local_38;
  
  local_38.pointer.ptr = (char *)uncompressed_string.value._8_8_;
  local_38._0_8_ = uncompressed_string.value._0_8_;
  bVar4 = HasEnoughSpace(this,compressed_string_len);
  if (!bVar4) {
    Flush(this,false);
    bVar4 = HasEnoughSpace(this,compressed_string_len);
    if (!bVar4) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,
                 "FSST string compression failed due to insufficient space in empty block","");
      InternalException::InternalException(this_00,&local_58);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  pCVar7 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  StringStats::Update(&(pCVar7->stats).statistics,(string_t *)&local_38.pointer);
  uVar6 = (this->current_dictionary).size + (int)compressed_string_len;
  (this->current_dictionary).size = uVar6;
  switchD_012dd528::default
            (this->current_end_ptr + -(ulong)uVar6,compressed_string,compressed_string_len);
  pBVar2 = (this->super_CompressionState).info.block_manager;
  optional_idx::GetIndex(&pBVar2->block_alloc_size);
  optional_idx::GetIndex(&pBVar2->block_header_size);
  local_58._M_dataplus._M_p._0_4_ =
       NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(compressed_string_len);
  __position._M_current =
       (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&(this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
               __position,(uint *)&local_58);
  }
  else {
    *__position._M_current = (uint)local_58._M_dataplus._M_p;
    (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  if (compressed_string_len < this->max_compressed_string_length) {
    compressed_string_len = this->max_compressed_string_length;
  }
  this->max_compressed_string_length = compressed_string_len;
  lVar3 = 0x3f;
  if (compressed_string_len != 0) {
    for (; compressed_string_len >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  bVar8 = '@';
  if (compressed_string_len >> 0x38 == 0) {
    bVar8 = '@' - ((byte)lVar3 ^ 0x3f);
  }
  bVar5 = '\0';
  if (compressed_string_len != 0) {
    bVar5 = bVar8;
  }
  this->current_width = bVar5;
  pCVar7 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  LOCK();
  paVar1 = &(pCVar7->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void UpdateState(string_t uncompressed_string, unsigned char *compressed_string, size_t compressed_string_len) {
		if (!HasEnoughSpace(compressed_string_len)) {
			Flush();
			if (!HasEnoughSpace(compressed_string_len)) {
				throw InternalException("FSST string compression failed due to insufficient space in empty block");
			};
		}

		UncompressedStringStorage::UpdateStringStats(current_segment->stats, uncompressed_string);

		// Write string into dictionary
		current_dictionary.size += compressed_string_len;
		auto dict_pos = current_end_ptr - current_dictionary.size;
		memcpy(dict_pos, compressed_string, compressed_string_len);
		current_dictionary.Verify(info.GetBlockSize());

		// We just push the string length to effectively delta encode the strings
		index_buffer.push_back(NumericCast<uint32_t>(compressed_string_len));

		max_compressed_string_length = MaxValue(max_compressed_string_length, compressed_string_len);

		current_width = BitpackingPrimitives::MinimumBitWidth(max_compressed_string_length);
		current_segment->count++;
	}